

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O1

void __thiscall AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag(AutoSetDispatchHaltFlag *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebugContext *pDVar4;
  
  if (this->m_threadContext->debugManager->isAtDispatchHalt == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xe6,"(m_threadContext->GetDebugManager()->IsAtDispatchHalt())",
                       "m_threadContext->GetDebugManager()->IsAtDispatchHalt()");
    if (!bVar2) goto LAB_008b923b;
    *puVar3 = 0;
  }
  this->m_threadContext->debugManager->isAtDispatchHalt = false;
  pDVar4 = Js::ScriptContext::GetDebugContext(this->m_scriptContext);
  if (pDVar4->diagProbesContainer->isPrimaryBrokenToDebuggerContext == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                       ,0xe9,
                       "(m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext())"
                       ,
                       "m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext()"
                      );
    if (!bVar2) {
LAB_008b923b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pDVar4 = Js::ScriptContext::GetDebugContext(this->m_scriptContext);
  pDVar4->diagProbesContainer->isPrimaryBrokenToDebuggerContext = false;
  return;
}

Assistant:

AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag()
{
    Assert(m_threadContext->GetDebugManager()->IsAtDispatchHalt());
    m_threadContext->GetDebugManager()->SetDispatchHalt(false);

    Assert(m_scriptContext->GetDebugContext()->GetProbeContainer()->IsPrimaryBrokenToDebuggerContext());
    m_scriptContext->GetDebugContext()->GetProbeContainer()->SetIsPrimaryBrokenToDebuggerContext(false);
}